

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_test.c
# Opt level: O0

int main(int argc,char **argv)

{
  mat44 R_00;
  int iVar1;
  uint uVar2;
  char *pcVar3;
  nifti_image *pnVar4;
  nifti_image *pnVar5;
  nifti_image *nim_00;
  bool bVar6;
  bool local_2754;
  bool local_2753;
  bool local_2752;
  bool local_2751;
  bool local_2741;
  bool local_2731;
  bool local_2721;
  bool local_2711;
  bool local_2701;
  bool local_26f1;
  bool local_26e1;
  bool local_26d1;
  bool local_26c1;
  bool local_23e1;
  bool local_23d1;
  uint local_23c4;
  znzFile local_23a8;
  znzFile f;
  nifti_image *nim_1;
  mat44 x_3;
  float qfac;
  float dz;
  float dy;
  float dx;
  float qz;
  float qy;
  float qx;
  float qd;
  float qc;
  float qb;
  uint j;
  uint i;
  mat44 R;
  char buf_100 [64];
  int local_22a0;
  int local_229c;
  int swapsize_8;
  int nbyper_8;
  char buf_99 [64];
  int local_2250;
  int local_224c;
  int swapsize_7;
  int nbyper_7;
  char buf_98 [64];
  int local_2200;
  int local_21fc;
  int swapsize_6;
  int nbyper_6;
  char buf_97 [64];
  int local_21b0;
  int local_21ac;
  int swapsize_5;
  int nbyper_5;
  char buf_96 [64];
  int local_2160;
  int local_215c;
  int swapsize_4;
  int nbyper_4;
  char buf_95 [64];
  int local_2110;
  int local_210c;
  int swapsize_3;
  int nbyper_3;
  char buf_94 [64];
  int local_20c0;
  int local_20bc;
  int swapsize_2;
  int nbyper_2;
  char buf_93 [64];
  int local_2070;
  int local_206c;
  int swapsize_1;
  int nbyper_1;
  char buf_92 [64];
  int local_2020;
  int local_201c;
  int swapsize;
  int nbyper;
  char buf_91 [64];
  char buf_90 [64];
  char buf_89 [64];
  char buf_88 [64];
  char buf_87 [64];
  char buf_86 [64];
  char buf_85 [64];
  char buf_84 [64];
  char buf_83 [64];
  char buf_82 [64];
  char buf_81 [64];
  char buf_80 [64];
  char buf_79 [64];
  char buf_78 [64];
  char buf_77 [64];
  char buf_76 [64];
  char buf_75 [64];
  char buf_74 [64];
  char buf_73 [64];
  char buf_72 [64];
  char buf_71 [64];
  char buf_70 [64];
  char buf_69 [64];
  char buf_68 [64];
  char buf_67 [64];
  char buf_66 [64];
  char buf_65 [64];
  char buf_64 [64];
  char buf_63 [64];
  char buf_62 [64];
  char buf_61 [64];
  char buf_60 [64];
  char buf_59 [64];
  char buf_58 [64];
  char buf_57 [64];
  char buf_56 [64];
  char buf_55 [64];
  char buf_54 [64];
  char buf_53 [64];
  char buf_52 [64];
  char buf_51 [64];
  char buf_50 [64];
  char buf_49 [64];
  char buf_48 [64];
  char buf_47 [64];
  char buf_46 [64];
  char buf_45 [64];
  char buf_44 [64];
  char buf_43 [64];
  char buf_42 [64];
  char buf_41 [64];
  char buf_40 [64];
  char buf_39 [64];
  char buf_38 [64];
  char buf_37 [64];
  char buf_36 [64];
  char buf_35 [64];
  char buf_34 [64];
  char buf_33 [64];
  char buf_32 [64];
  char buf_31 [64];
  char buf_30 [64];
  char buf_29 [64];
  char buf_28 [64];
  char buf_27 [64];
  char buf_26 [64];
  char buf_25 [64];
  char buf_24 [64];
  char buf_23 [64];
  char buf_22 [64];
  char buf_21 [64];
  char buf_20 [64];
  char buf_19 [64];
  char buf_18 [64];
  char buf_17 [64];
  char buf_16 [64];
  char buf_15 [64];
  char buf_14 [64];
  char buf_13 [64];
  char buf_12 [64];
  char buf_11 [64];
  char buf_10 [64];
  char buf_9 [64];
  char buf_8 [64];
  char buf_7 [64];
  char buf_6 [64];
  char buf_5 [64];
  char buf_4 [64];
  char buf_3 [64];
  char buf_2 [64];
  char *basename;
  int KnownValid_1;
  int KnownValid;
  uint fni;
  int KNOWN_nifti_is_complete_filename [8];
  int KNOWN_nifti_validfilename [8];
  char *KNOWN_FILE_BASENAMES [8];
  char *FILE_NAMES [8];
  nifti_image *reloaded_image_1;
  nifti_image *reference_image_1;
  int IsNiftiFile;
  char *imgname;
  char buf_1 [512];
  nifti_1_header x_2;
  int blist [5];
  nifti_image *nim_select;
  nifti_image *nim_orig;
  nifti_brick_list NB_select;
  nifti_brick_list NB_orig;
  int result;
  nifti_image *reloaded_image;
  nifti_image *nim;
  nifti_image *reference_image;
  char local_4b8 [4];
  int CompressedTwoFile;
  char buf [512];
  uint local_2ac;
  char local_2a8 [4];
  uint filenameindex;
  char write_image_filename [6] [64];
  uint local_11c;
  char local_118 [4];
  int Errors;
  char TEMP_STR [256];
  char **argv_local;
  int argc_local;
  
  TEMP_STR._248_8_ = argv;
  nifti_set_debug_level(3);
  local_11c = 0;
  _PrintTest(0xa5,"NOT REALLY AN ERROR, JUST TESTING THE ERROR TEST REPORTING MECHANISM",1,
             NIFTITEST_FALSE,(int *)&local_11c);
  _PrintTest(0xa6,"NOT REALLY AN ERROR, JUST TESTING THE ERROR COUNTING MECHANISM",
             (uint)(local_11c == 1),NIFTITEST_FALSE,(int *)&local_11c);
  local_11c = 0;
  memcpy(local_2a8,"ATestReferenceImageForReadingAndWriting.nii",0x180);
  printf("======= Testing All Nifti Valid Names ======\n");
  fflush(_stdout);
  for (local_2ac = 0; local_2ac < 6; local_2ac = local_2ac + 1) {
    pcVar3 = strstr(local_2a8 + (ulong)local_2ac * 0x40,".img.gz");
    bVar6 = true;
    if (pcVar3 == (char *)0x0) {
      pcVar3 = strstr(local_2a8 + (ulong)local_2ac * 0x40,".hdr.gz");
      bVar6 = pcVar3 != (char *)0x0;
    }
    printf("======= Testing with filename: %s ======\n",local_2a8 + (ulong)local_2ac * 0x40);
    fflush(_stdout);
    pnVar4 = generate_reference_image(local_2a8 + (ulong)local_2ac * 0x40,(int *)&local_11c);
    sprintf(local_4b8,"nifti_add_extension %s",local_2a8 + (ulong)local_2ac * 0x40);
    iVar1 = nifti_add_extension(pnVar4,main::ext,0xf,6);
    _PrintTest(200,local_4b8,(uint)(iVar1 == -1),NIFTITEST_FALSE,(int *)&local_11c);
    sprintf(local_4b8,"valid_nifti_extension %s",local_2a8 + (ulong)local_2ac * 0x40);
    iVar1 = valid_nifti_extensions(pnVar4);
    _PrintTest(0xcc,"valid_nifti_extensions",(uint)(iVar1 == 0),NIFTITEST_FALSE,(int *)&local_11c);
    _PrintTest(0xce,"Create reference image",(uint)(pnVar4 == (nifti_image *)0x0),NIFTITEST_TRUE,
               (int *)&local_11c);
    nifti_image_write(pnVar4);
    pnVar5 = nifti_simple_init_nim();
    iVar1 = nifti_copy_extensions(pnVar5,pnVar4);
    _PrintTest(0xd7,"nifti_copy_extension",iVar1,NIFTITEST_FALSE,(int *)&local_11c);
    nifti_image_free(pnVar5);
    pnVar5 = nifti_copy_nim_info(pnVar4);
    _PrintTest(0xdd,"nifti_copy_nim_info",(uint)(pnVar5 == (nifti_image *)0x0),NIFTITEST_FALSE,
               (int *)&local_11c);
    iVar1 = nifti_nim_is_valid(pnVar5,0);
    _PrintTest(0xe0,"nifti_nim_is_valid",(uint)(iVar1 == 0),NIFTITEST_FALSE,(int *)&local_11c);
    nifti_image_free(pnVar5);
    pnVar5 = nifti_image_read(pnVar4->fname,1);
    _PrintTest(0xe8,"Reload of image ",(uint)(pnVar5 == (nifti_image *)0x0),NIFTITEST_TRUE,
               (int *)&local_11c);
    iVar1 = valid_nifti_extensions(pnVar5);
    sprintf(local_4b8,"reload valid_nifti_extensions %s",local_2a8 + (ulong)local_2ac * 0x40);
    if (bVar6) {
      bVar6 = iVar1 != 0;
    }
    else {
      bVar6 = iVar1 == 0;
    }
    local_23c4 = (uint)bVar6;
    _PrintTest(0xf5,local_4b8,local_23c4,NIFTITEST_FALSE,(int *)&local_11c);
    nifti_image_infodump(pnVar5);
    compare_reference_image_values(pnVar4,pnVar5,(int *)&local_11c);
    nifti_image_free(pnVar5);
    x_2.intent_name[0xc] = '\a';
    x_2.intent_name[0xd] = '\0';
    x_2.intent_name[0xe] = '\0';
    x_2.intent_name[0xf] = '\0';
    x_2.magic[0] = '\0';
    x_2.magic[1] = '\0';
    x_2.magic[2] = '\0';
    x_2.magic[3] = '\0';
    pnVar5 = nifti_image_read_bricks
                       (pnVar4->fname,0,(int *)(x_2.intent_name + 0xc),
                        (nifti_brick_list *)&NB_select.bricks);
    _PrintTest(0x107,"invalid arg bricked image read 1",(uint)(pnVar5 != (nifti_image *)0x0),
               NIFTITEST_FALSE,(int *)&local_11c);
    pnVar5 = nifti_image_read_bricks
                       (pnVar4->fname,0,(int *)0x0,(nifti_brick_list *)&NB_select.bricks);
    _PrintTest(0x10a,"Reload of bricked image",(uint)(pnVar5 == (nifti_image *)0x0),NIFTITEST_FALSE,
               (int *)&local_11c);
    nifti_free_NBL((nifti_brick_list *)&NB_select.bricks);
    nifti_image_free(pnVar5);
    nim_00 = nifti_image_read_bricks
                       (pnVar4->fname,5,(int *)(x_2.intent_name + 0xc),(nifti_brick_list *)&nim_orig
                       );
    _PrintTest(0x10f,"Reload of bricked image with blist",(uint)(pnVar5 == (nifti_image *)0x0),
               NIFTITEST_FALSE,(int *)&local_11c);
    nifti_free_NBL((nifti_brick_list *)&nim_orig);
    nifti_image_free(nim_00);
    iVar1 = nifti_update_dims_from_array(pnVar4);
    _PrintTest(0x119,"nifti_update_dims_from_array -- valid dims",(uint)(iVar1 != 0),NIFTITEST_FALSE
               ,(int *)&local_11c);
    pnVar4->dim[0] = 8;
    iVar1 = nifti_update_dims_from_array(pnVar4);
    _PrintTest(0x11d,"nifti_update_dims_from_array -- invalid dims",(uint)(iVar1 == 0),
               NIFTITEST_FALSE,(int *)&local_11c);
    nifti_convert_nim2nhdr((nifti_1_header *)(buf_1 + 0x1fc),pnVar4);
    sprintf((char *)&imgname,"nifti_hdr_looks_good %s",pnVar4->fname);
    iVar1 = nifti_hdr_looks_good((nifti_1_header *)(buf_1 + 0x1fc));
    _PrintTest(0x124,(char *)&imgname,(uint)((iVar1 != 0 ^ 0xffU) & 1),NIFTITEST_FALSE,
               (int *)&local_11c);
    nifti_image_free(pnVar4);
  }
  pcVar3 = nifti_findimgname("ATestReferenceImageForReadingAndWriting.hdr",2);
  local_23d1 = true;
  if (pcVar3 != (char *)0x0) {
    iVar1 = strcmp(pcVar3,"ATestReferenceImageForReadingAndWriting.img");
    local_23d1 = iVar1 != 0;
  }
  _PrintTest(0x131,"nifti_findimgname",(uint)local_23d1,NIFTITEST_FALSE,(int *)&local_11c);
  free(pcVar3);
  iVar1 = is_nifti_file(local_2a8);
  _PrintTest(0x138,"is_nifti_file0",(uint)(iVar1 != 1),NIFTITEST_FALSE,(int *)&local_11c);
  iVar1 = is_nifti_file(write_image_filename[0] + 0x38);
  _PrintTest(0x13b,"is_nifti_file1",(uint)(iVar1 != 2),NIFTITEST_FALSE,(int *)&local_11c);
  iVar1 = is_nifti_file(write_image_filename[2] + 0x38);
  _PrintTest(0x13e,"is_nifti_file2",(uint)(iVar1 != 1),NIFTITEST_FALSE,(int *)&local_11c);
  iVar1 = is_nifti_file(write_image_filename[3] + 0x38);
  _PrintTest(0x141,"is_nifti_file2",(uint)(iVar1 != 2),NIFTITEST_FALSE,(int *)&local_11c);
  pnVar4 = generate_reference_image("TestAsciiImage.nia",(int *)&local_11c);
  pnVar4->nifti_type = 3;
  nifti_image_write(pnVar4);
  pnVar5 = nifti_image_read("TestAsciiImage.nia",1);
  _PrintTest(0x14f,"Read/Write Ascii image",(uint)(pnVar5 == (nifti_image *)0x0),NIFTITEST_FALSE,
             (int *)&local_11c);
  nifti_image_free(pnVar4);
  nifti_image_free(pnVar5);
  memcpy(KNOWN_FILE_BASENAMES + 7,&PTR_anon_var_dwarf_1069_001296f0,0x40);
  memcpy(KNOWN_nifti_validfilename + 6,&PTR_anon_var_dwarf_1069_00129730,0x40);
  KNOWN_nifti_is_complete_filename[6] = 1;
  KNOWN_nifti_is_complete_filename[7] = 1;
  KNOWN_nifti_validfilename[0] = 1;
  KNOWN_nifti_validfilename[1] = 1;
  KNOWN_nifti_validfilename[2] = 1;
  KNOWN_nifti_validfilename[3] = 0;
  KNOWN_nifti_validfilename[4] = 1;
  KNOWN_nifti_validfilename[5] = 1;
  _KnownValid = 0;
  KNOWN_nifti_is_complete_filename[0] = 0;
  KNOWN_nifti_is_complete_filename[1] = 1;
  KNOWN_nifti_is_complete_filename[2] = 1;
  KNOWN_nifti_is_complete_filename[3] = 0;
  KNOWN_nifti_is_complete_filename[4] = 0;
  KNOWN_nifti_is_complete_filename[5] = 1;
  for (KnownValid_1 = 0; (uint)KnownValid_1 < 8; KnownValid_1 = KnownValid_1 + 1) {
    printf("\nTesting \"%s\" filename\n",KNOWN_FILE_BASENAMES[(ulong)(uint)KnownValid_1 + 7]);
    uVar2 = nifti_validfilename(KNOWN_FILE_BASENAMES[(ulong)(uint)KnownValid_1 + 7]);
    snprintf(local_118,0x100,"nifti_validfilename(\"%s\")=%d",
             KNOWN_FILE_BASENAMES[(ulong)(uint)KnownValid_1 + 7],(ulong)uVar2);
    _PrintTest(0x185,local_118,
               (uint)(uVar2 != KNOWN_nifti_is_complete_filename[(ulong)(uint)KnownValid_1 + 6]),
               NIFTITEST_FALSE,(int *)&local_11c);
    uVar2 = nifti_is_complete_filename(KNOWN_FILE_BASENAMES[(ulong)(uint)KnownValid_1 + 7]);
    snprintf(local_118,0x100,"nifti_is_complete_filename(\"%s\")=%d",
             KNOWN_FILE_BASENAMES[(ulong)(uint)KnownValid_1 + 7],(ulong)uVar2);
    _PrintTest(0x18a,local_118,(uint)(uVar2 != (&KnownValid)[(uint)KnownValid_1]),NIFTITEST_FALSE,
               (int *)&local_11c);
    pcVar3 = nifti_makebasename(KNOWN_FILE_BASENAMES[(ulong)(uint)KnownValid_1 + 7]);
    snprintf(local_118,0x100,"nifti_makebasename(\"%s\")=\"%s\"",
             KNOWN_FILE_BASENAMES[(ulong)(uint)KnownValid_1 + 7],pcVar3);
    iVar1 = strcmp(pcVar3,KNOWN_FILE_BASENAMES[(ulong)(uint)KnownValid_1 - 1]);
    _PrintTest(400,local_118,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
    free(pcVar3);
  }
  nifti_disp_lib_hist();
  nifti_disp_lib_version();
  pnVar4 = nifti_image_read_bricks((char *)0x0,-1,(int *)0x0,(nifti_brick_list *)0x0);
  _PrintTest(0x1a2,"nifti_image_read_bricks 1",(uint)(pnVar4 != (nifti_image *)0x0),NIFTITEST_FALSE,
             (int *)&local_11c);
  pnVar4 = nifti_image_read_bricks("NOFILE.NOFILE",-1,(int *)0x0,(nifti_brick_list *)0x0);
  _PrintTest(0x1a7,"nifti_image_read_bricks 1",(uint)(pnVar4 != (nifti_image *)0x0),NIFTITEST_FALSE,
             (int *)&local_11c);
  sprintf(buf_3 + 0x38,"nifti_datatype_string %s","UNKNOWN");
  pcVar3 = nifti_datatype_string(0);
  iVar1 = strcmp(pcVar3,"UNKNOWN");
  _PrintTest(0x1b6,buf_3 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_4 + 0x38,"nifti_datatype_string %s","BINARY");
  pcVar3 = nifti_datatype_string(1);
  iVar1 = strcmp(pcVar3,"BINARY");
  _PrintTest(0x1b7,buf_4 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_5 + 0x38,"nifti_datatype_string %s","INT8");
  pcVar3 = nifti_datatype_string(0x100);
  iVar1 = strcmp(pcVar3,"INT8");
  _PrintTest(0x1b8,buf_5 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_6 + 0x38,"nifti_datatype_string %s","UINT8");
  pcVar3 = nifti_datatype_string(2);
  iVar1 = strcmp(pcVar3,"UINT8");
  _PrintTest(0x1b9,buf_6 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_7 + 0x38,"nifti_datatype_string %s","INT16");
  pcVar3 = nifti_datatype_string(4);
  iVar1 = strcmp(pcVar3,"INT16");
  _PrintTest(0x1ba,buf_7 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_8 + 0x38,"nifti_datatype_string %s","UINT16");
  pcVar3 = nifti_datatype_string(0x200);
  iVar1 = strcmp(pcVar3,"UINT16");
  _PrintTest(0x1bb,buf_8 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_9 + 0x38,"nifti_datatype_string %s","INT32");
  pcVar3 = nifti_datatype_string(8);
  iVar1 = strcmp(pcVar3,"INT32");
  _PrintTest(0x1bc,buf_9 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_10 + 0x38,"nifti_datatype_string %s","UINT32");
  pcVar3 = nifti_datatype_string(0x300);
  iVar1 = strcmp(pcVar3,"UINT32");
  _PrintTest(0x1bd,buf_10 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_11 + 0x38,"nifti_datatype_string %s","INT64");
  pcVar3 = nifti_datatype_string(0x400);
  iVar1 = strcmp(pcVar3,"INT64");
  _PrintTest(0x1be,buf_11 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_12 + 0x38,"nifti_datatype_string %s","UINT64");
  pcVar3 = nifti_datatype_string(0x500);
  iVar1 = strcmp(pcVar3,"UINT64");
  _PrintTest(0x1bf,buf_12 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_13 + 0x38,"nifti_datatype_string %s","FLOAT32");
  pcVar3 = nifti_datatype_string(0x10);
  iVar1 = strcmp(pcVar3,"FLOAT32");
  _PrintTest(0x1c0,buf_13 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_14 + 0x38,"nifti_datatype_string %s","FLOAT64");
  pcVar3 = nifti_datatype_string(0x40);
  iVar1 = strcmp(pcVar3,"FLOAT64");
  _PrintTest(0x1c1,buf_14 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_15 + 0x38,"nifti_datatype_string %s","FLOAT128");
  pcVar3 = nifti_datatype_string(0x600);
  iVar1 = strcmp(pcVar3,"FLOAT128");
  _PrintTest(0x1c2,buf_15 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_16 + 0x38,"nifti_datatype_string %s","COMPLEX64");
  pcVar3 = nifti_datatype_string(0x20);
  iVar1 = strcmp(pcVar3,"COMPLEX64");
  _PrintTest(0x1c3,buf_16 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_17 + 0x38,"nifti_datatype_string %s","COMPLEX128");
  pcVar3 = nifti_datatype_string(0x700);
  iVar1 = strcmp(pcVar3,"COMPLEX128");
  _PrintTest(0x1c4,buf_17 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_18 + 0x38,"nifti_datatype_string %s","COMPLEX256");
  pcVar3 = nifti_datatype_string(0x800);
  iVar1 = strcmp(pcVar3,"COMPLEX256");
  _PrintTest(0x1c5,buf_18 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_19 + 0x38,"nifti_datatype_string %s","RGB24");
  pcVar3 = nifti_datatype_string(0x80);
  iVar1 = strcmp(pcVar3,"RGB24");
  _PrintTest(0x1c6,buf_19 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_20 + 0x38,"nifti_datatype_string %d",0);
  iVar1 = nifti_is_inttype(0);
  _PrintTest(0x1d1,buf_20 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_21 + 0x38,"nifti_datatype_string %d",1);
  iVar1 = nifti_is_inttype(1);
  _PrintTest(0x1d2,buf_21 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_22 + 0x38,"nifti_datatype_string %d",0x100);
  iVar1 = nifti_is_inttype(0x100);
  _PrintTest(0x1d3,buf_22 + 0x38,(uint)(iVar1 != 1),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_23 + 0x38,"nifti_datatype_string %d",2);
  iVar1 = nifti_is_inttype(2);
  _PrintTest(0x1d4,buf_23 + 0x38,(uint)(iVar1 != 1),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_24 + 0x38,"nifti_datatype_string %d",4);
  iVar1 = nifti_is_inttype(4);
  _PrintTest(0x1d5,buf_24 + 0x38,(uint)(iVar1 != 1),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_25 + 0x38,"nifti_datatype_string %d",0x200);
  iVar1 = nifti_is_inttype(0x200);
  _PrintTest(0x1d6,buf_25 + 0x38,(uint)(iVar1 != 1),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_26 + 0x38,"nifti_datatype_string %d",8);
  iVar1 = nifti_is_inttype(8);
  _PrintTest(0x1d7,buf_26 + 0x38,(uint)(iVar1 != 1),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_27 + 0x38,"nifti_datatype_string %d",0x300);
  iVar1 = nifti_is_inttype(0x300);
  _PrintTest(0x1d8,buf_27 + 0x38,(uint)(iVar1 != 1),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_28 + 0x38,"nifti_datatype_string %d",0x400);
  iVar1 = nifti_is_inttype(0x400);
  _PrintTest(0x1d9,buf_28 + 0x38,(uint)(iVar1 != 1),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_29 + 0x38,"nifti_datatype_string %d",0x500);
  iVar1 = nifti_is_inttype(0x500);
  _PrintTest(0x1da,buf_29 + 0x38,(uint)(iVar1 != 1),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_30 + 0x38,"nifti_datatype_string %d",0x10);
  iVar1 = nifti_is_inttype(0x10);
  _PrintTest(0x1db,buf_30 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_31 + 0x38,"nifti_datatype_string %d",0x40);
  iVar1 = nifti_is_inttype(0x40);
  _PrintTest(0x1dc,buf_31 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_32 + 0x38,"nifti_datatype_string %d",0x600);
  iVar1 = nifti_is_inttype(0x600);
  _PrintTest(0x1dd,buf_32 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_33 + 0x38,"nifti_datatype_string %d",0x20);
  iVar1 = nifti_is_inttype(0x20);
  _PrintTest(0x1de,buf_33 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_34 + 0x38,"nifti_datatype_string %d",0x700);
  iVar1 = nifti_is_inttype(0x700);
  _PrintTest(0x1df,buf_34 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_35 + 0x38,"nifti_datatype_string %d",0x800);
  iVar1 = nifti_is_inttype(0x800);
  _PrintTest(0x1e0,buf_35 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_36 + 0x38,"nifti_datatype_string %d",0x80);
  iVar1 = nifti_is_inttype(0x80);
  _PrintTest(0x1e1,buf_36 + 0x38,(uint)(iVar1 != 1),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_37 + 0x38,"nifti_units_string_test %s","m");
  pcVar3 = nifti_units_string(1);
  iVar1 = strcmp(pcVar3,"m");
  _PrintTest(0x1ec,buf_37 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_38 + 0x38,"nifti_units_string_test %s","mm");
  pcVar3 = nifti_units_string(2);
  iVar1 = strcmp(pcVar3,"mm");
  _PrintTest(0x1ed,buf_38 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_39 + 0x38,"nifti_units_string_test %s","um");
  pcVar3 = nifti_units_string(3);
  iVar1 = strcmp(pcVar3,"um");
  _PrintTest(0x1ee,buf_39 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_40 + 0x38,"nifti_units_string_test %s","s");
  pcVar3 = nifti_units_string(8);
  iVar1 = strcmp(pcVar3,"s");
  _PrintTest(0x1ef,buf_40 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_41 + 0x38,"nifti_units_string_test %s","ms");
  pcVar3 = nifti_units_string(0x10);
  iVar1 = strcmp(pcVar3,"ms");
  _PrintTest(0x1f0,buf_41 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_42 + 0x38,"nifti_units_string_test %s","us");
  pcVar3 = nifti_units_string(0x18);
  iVar1 = strcmp(pcVar3,"us");
  _PrintTest(0x1f1,buf_42 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_43 + 0x38,"nifti_units_string_test %s","Hz");
  pcVar3 = nifti_units_string(0x20);
  iVar1 = strcmp(pcVar3,"Hz");
  _PrintTest(0x1f2,buf_43 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_44 + 0x38,"nifti_units_string_test %s","ppm");
  pcVar3 = nifti_units_string(0x28);
  iVar1 = strcmp(pcVar3,"ppm");
  _PrintTest(499,buf_44 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_45 + 0x38,"nifti_units_string_test %s","rad/s");
  pcVar3 = nifti_units_string(0x30);
  iVar1 = strcmp(pcVar3,"rad/s");
  _PrintTest(500,buf_45 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_46 + 0x38,"nifti_intent_string %s","Correlation statistic");
  pcVar3 = nifti_intent_string(2);
  iVar1 = strcmp(pcVar3,"Correlation statistic");
  _PrintTest(0x1ff,buf_46 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_47 + 0x38,"nifti_intent_string %s","T-statistic");
  pcVar3 = nifti_intent_string(3);
  iVar1 = strcmp(pcVar3,"T-statistic");
  _PrintTest(0x200,buf_47 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_48 + 0x38,"nifti_intent_string %s","F-statistic");
  pcVar3 = nifti_intent_string(4);
  iVar1 = strcmp(pcVar3,"F-statistic");
  _PrintTest(0x201,buf_48 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_49 + 0x38,"nifti_intent_string %s","Z-score");
  pcVar3 = nifti_intent_string(5);
  iVar1 = strcmp(pcVar3,"Z-score");
  _PrintTest(0x202,buf_49 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_50 + 0x38,"nifti_intent_string %s","Chi-squared distribution");
  pcVar3 = nifti_intent_string(6);
  iVar1 = strcmp(pcVar3,"Chi-squared distribution");
  _PrintTest(0x203,buf_50 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_51 + 0x38,"nifti_intent_string %s","Beta distribution");
  pcVar3 = nifti_intent_string(7);
  iVar1 = strcmp(pcVar3,"Beta distribution");
  _PrintTest(0x204,buf_51 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_52 + 0x38,"nifti_intent_string %s","Binomial distribution");
  pcVar3 = nifti_intent_string(8);
  iVar1 = strcmp(pcVar3,"Binomial distribution");
  _PrintTest(0x205,buf_52 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_53 + 0x38,"nifti_intent_string %s","Gamma distribution");
  pcVar3 = nifti_intent_string(9);
  iVar1 = strcmp(pcVar3,"Gamma distribution");
  _PrintTest(0x206,buf_53 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_54 + 0x38,"nifti_intent_string %s","Poisson distribution");
  pcVar3 = nifti_intent_string(10);
  iVar1 = strcmp(pcVar3,"Poisson distribution");
  _PrintTest(0x207,buf_54 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_55 + 0x38,"nifti_intent_string %s","Normal distribution");
  pcVar3 = nifti_intent_string(0xb);
  iVar1 = strcmp(pcVar3,"Normal distribution");
  _PrintTest(0x208,buf_55 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_56 + 0x38,"nifti_intent_string %s","F-statistic noncentral");
  pcVar3 = nifti_intent_string(0xc);
  iVar1 = strcmp(pcVar3,"F-statistic noncentral");
  _PrintTest(0x209,buf_56 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_57 + 0x38,"nifti_intent_string %s","Chi-squared noncentral");
  pcVar3 = nifti_intent_string(0xd);
  iVar1 = strcmp(pcVar3,"Chi-squared noncentral");
  _PrintTest(0x20a,buf_57 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_58 + 0x38,"nifti_intent_string %s","Logistic distribution");
  pcVar3 = nifti_intent_string(0xe);
  iVar1 = strcmp(pcVar3,"Logistic distribution");
  _PrintTest(0x20b,buf_58 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_59 + 0x38,"nifti_intent_string %s","Laplace distribution");
  pcVar3 = nifti_intent_string(0xf);
  iVar1 = strcmp(pcVar3,"Laplace distribution");
  _PrintTest(0x20c,buf_59 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_60 + 0x38,"nifti_intent_string %s","Uniform distribition");
  pcVar3 = nifti_intent_string(0x10);
  iVar1 = strcmp(pcVar3,"Uniform distribition");
  _PrintTest(0x20d,buf_60 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_61 + 0x38,"nifti_intent_string %s","T-statistic noncentral");
  pcVar3 = nifti_intent_string(0x11);
  iVar1 = strcmp(pcVar3,"T-statistic noncentral");
  _PrintTest(0x20e,buf_61 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_62 + 0x38,"nifti_intent_string %s","Weibull distribution");
  pcVar3 = nifti_intent_string(0x12);
  iVar1 = strcmp(pcVar3,"Weibull distribution");
  _PrintTest(0x20f,buf_62 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_63 + 0x38,"nifti_intent_string %s","Chi distribution");
  pcVar3 = nifti_intent_string(0x13);
  iVar1 = strcmp(pcVar3,"Chi distribution");
  _PrintTest(0x210,buf_63 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_64 + 0x38,"nifti_intent_string %s","Inverse Gaussian distribution");
  pcVar3 = nifti_intent_string(0x14);
  iVar1 = strcmp(pcVar3,"Inverse Gaussian distribution");
  _PrintTest(0x211,buf_64 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_65 + 0x38,"nifti_intent_string %s","Extreme Value distribution");
  pcVar3 = nifti_intent_string(0x15);
  iVar1 = strcmp(pcVar3,"Extreme Value distribution");
  _PrintTest(0x212,buf_65 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_66 + 0x38,"nifti_intent_string %s","P-value");
  pcVar3 = nifti_intent_string(0x16);
  iVar1 = strcmp(pcVar3,"P-value");
  _PrintTest(0x213,buf_66 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_67 + 0x38,"nifti_intent_string %s","Log P-value");
  pcVar3 = nifti_intent_string(0x17);
  iVar1 = strcmp(pcVar3,"Log P-value");
  _PrintTest(0x214,buf_67 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_68 + 0x38,"nifti_intent_string %s","Log10 P-value");
  pcVar3 = nifti_intent_string(0x18);
  iVar1 = strcmp(pcVar3,"Log10 P-value");
  _PrintTest(0x215,buf_68 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_69 + 0x38,"nifti_intent_string %s","Estimate");
  pcVar3 = nifti_intent_string(0x3e9);
  iVar1 = strcmp(pcVar3,"Estimate");
  _PrintTest(0x216,buf_69 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_70 + 0x38,"nifti_intent_string %s","Label index");
  pcVar3 = nifti_intent_string(0x3ea);
  iVar1 = strcmp(pcVar3,"Label index");
  _PrintTest(0x217,buf_70 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_71 + 0x38,"nifti_intent_string %s","NeuroNames index");
  pcVar3 = nifti_intent_string(0x3eb);
  iVar1 = strcmp(pcVar3,"NeuroNames index");
  _PrintTest(0x218,buf_71 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_72 + 0x38,"nifti_intent_string %s","General matrix");
  pcVar3 = nifti_intent_string(0x3ec);
  iVar1 = strcmp(pcVar3,"General matrix");
  _PrintTest(0x219,buf_72 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_73 + 0x38,"nifti_intent_string %s","Symmetric matrix");
  pcVar3 = nifti_intent_string(0x3ed);
  iVar1 = strcmp(pcVar3,"Symmetric matrix");
  _PrintTest(0x21a,buf_73 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_74 + 0x38,"nifti_intent_string %s","Displacement vector");
  pcVar3 = nifti_intent_string(0x3ee);
  iVar1 = strcmp(pcVar3,"Displacement vector");
  _PrintTest(0x21b,buf_74 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_75 + 0x38,"nifti_intent_string %s","Vector");
  pcVar3 = nifti_intent_string(0x3ef);
  iVar1 = strcmp(pcVar3,"Vector");
  _PrintTest(0x21c,buf_75 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_76 + 0x38,"nifti_intent_string %s","Pointset");
  pcVar3 = nifti_intent_string(0x3f0);
  iVar1 = strcmp(pcVar3,"Pointset");
  _PrintTest(0x21d,buf_76 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_77 + 0x38,"nifti_intent_string %s","Triangle");
  pcVar3 = nifti_intent_string(0x3f1);
  iVar1 = strcmp(pcVar3,"Triangle");
  _PrintTest(0x21e,buf_77 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_78 + 0x38,"nifti_intent_string %s","Quaternion");
  pcVar3 = nifti_intent_string(0x3f2);
  iVar1 = strcmp(pcVar3,"Quaternion");
  _PrintTest(0x21f,buf_78 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_79 + 0x38,"nifti_intent_string %s","Dimensionless number");
  pcVar3 = nifti_intent_string(0x3f3);
  iVar1 = strcmp(pcVar3,"Dimensionless number");
  _PrintTest(0x220,buf_79 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_80 + 0x38,"nifti_intent_string %s","Unknown");
  pcVar3 = nifti_intent_string(-200);
  iVar1 = strcmp(pcVar3,"Unknown");
  _PrintTest(0x221,buf_80 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_81 + 0x38,"nifti_slice_string_test %s","sequential_increasing");
  pcVar3 = nifti_slice_string(1);
  iVar1 = strcmp(pcVar3,"sequential_increasing");
  _PrintTest(0x22d,buf_81 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_82 + 0x38,"nifti_slice_string_test %s","sequential_decreasing");
  pcVar3 = nifti_slice_string(2);
  iVar1 = strcmp(pcVar3,"sequential_decreasing");
  _PrintTest(0x22e,buf_82 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_83 + 0x38,"nifti_slice_string_test %s","alternating_increasing");
  pcVar3 = nifti_slice_string(3);
  iVar1 = strcmp(pcVar3,"alternating_increasing");
  _PrintTest(0x22f,buf_83 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_84 + 0x38,"nifti_slice_string_test %s","alternating_decreasing");
  pcVar3 = nifti_slice_string(4);
  iVar1 = strcmp(pcVar3,"alternating_decreasing");
  _PrintTest(0x230,buf_84 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_85 + 0x38,"nifti_slice_string_test %s","alternating_increasing_2");
  pcVar3 = nifti_slice_string(5);
  iVar1 = strcmp(pcVar3,"alternating_increasing_2");
  _PrintTest(0x231,buf_85 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_86 + 0x38,"nifti_slice_string_test %s","alternating_decreasing_2");
  pcVar3 = nifti_slice_string(6);
  iVar1 = strcmp(pcVar3,"alternating_decreasing_2");
  _PrintTest(0x232,buf_86 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_87 + 0x38,"nifti_orientation_string_test %s","Left-to-Right");
  pcVar3 = nifti_orientation_string(1);
  iVar1 = strcmp(pcVar3,"Left-to-Right");
  _PrintTest(0x23d,buf_87 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_88 + 0x38,"nifti_orientation_string_test %s","Right-to-Left");
  pcVar3 = nifti_orientation_string(2);
  iVar1 = strcmp(pcVar3,"Right-to-Left");
  _PrintTest(0x23e,buf_88 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_89 + 0x38,"nifti_orientation_string_test %s","Posterior-to-Anterior");
  pcVar3 = nifti_orientation_string(3);
  iVar1 = strcmp(pcVar3,"Posterior-to-Anterior");
  _PrintTest(0x23f,buf_89 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_90 + 0x38,"nifti_orientation_string_test %s","Anterior-to-Posterior");
  pcVar3 = nifti_orientation_string(4);
  iVar1 = strcmp(pcVar3,"Anterior-to-Posterior");
  _PrintTest(0x240,buf_90 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf(buf_91 + 0x38,"nifti_orientation_string_test %s","Inferior-to-Superior");
  pcVar3 = nifti_orientation_string(5);
  iVar1 = strcmp(pcVar3,"Inferior-to-Superior");
  _PrintTest(0x241,buf_91 + 0x38,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf((char *)&swapsize,"nifti_orientation_string_test %s","Superior-to-Inferior");
  pcVar3 = nifti_orientation_string(6);
  iVar1 = strcmp(pcVar3,"Superior-to-Inferior");
  _PrintTest(0x242,(char *)&swapsize,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_11c);
  sprintf((char *)&swapsize_1,"nifti_datatype_sizes_test %d",2);
  nifti_datatype_sizes(2,&local_201c,&local_2020);
  local_23e1 = local_201c != 1 || local_2020 != 0;
  _PrintTest(0x252,(char *)&swapsize_1,(uint)local_23e1,NIFTITEST_FALSE,(int *)&local_11c);
  sprintf((char *)&swapsize_2,"nifti_datatype_sizes_test %d",0x200);
  nifti_datatype_sizes(0x200,&local_206c,&local_2070);
  local_26c1 = local_206c != 2 || local_2070 != 2;
  _PrintTest(0x253,(char *)&swapsize_2,(uint)local_26c1,NIFTITEST_FALSE,(int *)&local_11c);
  sprintf((char *)&swapsize_3,"nifti_datatype_sizes_test %d",0x80);
  nifti_datatype_sizes(0x80,&local_20bc,&local_20c0);
  local_26d1 = local_20bc != 3 || local_20c0 != 0;
  _PrintTest(0x254,(char *)&swapsize_3,(uint)local_26d1,NIFTITEST_FALSE,(int *)&local_11c);
  sprintf((char *)&swapsize_4,"nifti_datatype_sizes_test %d",0x10);
  nifti_datatype_sizes(0x10,&local_210c,&local_2110);
  local_26e1 = local_210c != 4 || local_2110 != 4;
  _PrintTest(0x255,(char *)&swapsize_4,(uint)local_26e1,NIFTITEST_FALSE,(int *)&local_11c);
  sprintf((char *)&swapsize_5,"nifti_datatype_sizes_test %d",0x20);
  nifti_datatype_sizes(0x20,&local_215c,&local_2160);
  local_26f1 = local_215c != 8 || local_2160 != 4;
  _PrintTest(0x256,(char *)&swapsize_5,(uint)local_26f1,NIFTITEST_FALSE,(int *)&local_11c);
  sprintf((char *)&swapsize_6,"nifti_datatype_sizes_test %d",0x500);
  nifti_datatype_sizes(0x500,&local_21ac,&local_21b0);
  local_2701 = local_21ac != 8 || local_21b0 != 8;
  _PrintTest(599,(char *)&swapsize_6,(uint)local_2701,NIFTITEST_FALSE,(int *)&local_11c);
  sprintf((char *)&swapsize_7,"nifti_datatype_sizes_test %d",0x600);
  nifti_datatype_sizes(0x600,&local_21fc,&local_2200);
  local_2711 = local_21fc != 0x10 || local_2200 != 0x10;
  _PrintTest(600,(char *)&swapsize_7,(uint)local_2711,NIFTITEST_FALSE,(int *)&local_11c);
  sprintf((char *)&swapsize_8,"nifti_datatype_sizes_test %d",0x700);
  nifti_datatype_sizes(0x700,&local_224c,&local_2250);
  local_2721 = local_224c != 0x10 || local_2250 != 8;
  _PrintTest(0x259,(char *)&swapsize_8,(uint)local_2721,NIFTITEST_FALSE,(int *)&local_11c);
  sprintf((char *)(R.m[3] + 2),"nifti_datatype_sizes_test %d",0x800);
  nifti_datatype_sizes(0x800,&local_229c,&local_22a0);
  local_2731 = local_229c != 0x20 || local_22a0 != 0x10;
  _PrintTest(0x25a,(char *)(R.m[3] + 2),(uint)local_2731,NIFTITEST_FALSE,(int *)&local_11c);
  for (qb = 0.0; (uint)qb < 4; qb = (float)((int)qb + 1)) {
    for (qc = 0.0; (uint)qc < 4; qc = (float)((int)qc + 1)) {
      (&j)[(ulong)(uint)qb * 4 + (ulong)(uint)qc] = (uint)(float)(qb == qc);
    }
  }
  R_00.m[0][2] = R.m[0][0];
  R_00.m[0][3] = R.m[0][1];
  R_00.m[0][0] = (float)j;
  R_00.m[0][1] = (float)i;
  R_00.m[1][0] = R.m[0][2];
  R_00.m[1][1] = R.m[0][3];
  R_00.m[1][2] = R.m[1][0];
  R_00.m[1][3] = R.m[1][1];
  R_00.m[2][0] = R.m[1][2];
  R_00.m[2][1] = R.m[1][3];
  R_00.m[2][2] = R.m[2][0];
  R_00.m[2][3] = R.m[2][1];
  R_00.m[3][0] = R.m[2][2];
  R_00.m[3][1] = R.m[2][3];
  R_00.m[3][2] = R.m[3][0];
  R_00.m[3][3] = R.m[3][1];
  nifti_mat44_to_quatern(R_00,&qd,&qx,&qy,&qz,&dx,&dy,&dz,&qfac,x_3.m[3] + 3,x_3.m[3] + 2);
  local_2741 = true;
  if ((qd == 0.0) && (!NAN(qd))) {
    local_2741 = true;
    if ((qx == 0.0) && (!NAN(qx))) {
      local_2741 = true;
      if ((qy == 0.0) && (!NAN(qy))) {
        local_2741 = true;
        if ((qz == 0.0) && (!NAN(qz))) {
          local_2741 = true;
          if ((dx == 0.0) && (!NAN(dx))) {
            local_2741 = true;
            if ((qy == 0.0) &&
               (((!NAN(qy) && (local_2741 = true, dz == 1.0)) && (local_2741 = true, qfac == 1.0))))
            {
              local_2741 = true;
              if ((x_3.m[3][3] == 1.0) && (!NAN(x_3.m[3][3]))) {
                local_2741 = x_3.m[3][2] != 1.0;
              }
            }
          }
        }
      }
    }
  }
  _PrintTest(0x272,"nifti_mat44_to_quatern",(uint)local_2741,NIFTITEST_FALSE,(int *)&local_11c);
  nifti_make_orthog_mat44((mat44 *)&nim_1,0.14,0.0,0.0,0.0,0.9,0.0,0.0,0.0,1.1);
  local_2751 = true;
  if ((nim_1._0_4_ == 1.0) && (local_2751 = true, x_3.m[0][3] == 1.0)) {
    local_2751 = true;
    if ((x_3.m[2][0] == 1.0) && (!NAN(x_3.m[2][0]))) {
      local_2751 = x_3.m[3][1] != 1.0;
    }
  }
  _PrintTest(0x27c,"nifti_make_orthog_mat44",(uint)local_2751,NIFTITEST_FALSE,(int *)&local_11c);
  nifti_swap_Nbytes(1,0x10,main::x);
  local_2752 = true;
  if ((((((main::x[0] == 'A') && (local_2752 = true, main::x[1] == 'B')) &&
        (local_2752 = true, main::x[2] == 'C')) &&
       (((local_2752 = true, main::x[3] == 'D' && (local_2752 = true, main::x[4] == 'E')) &&
        ((local_2752 = true, main::x[5] == 'F' &&
         ((local_2752 = true, main::x[6] == 'G' && (local_2752 = true, main::x[7] == 'H')))))))) &&
      ((local_2752 = true, main::x[8] == 'h' &&
       ((((local_2752 = true, main::x[9] == 'g' && (local_2752 = true, main::x[10] == 'f')) &&
         (local_2752 = true, main::x[0xb] == 'e')) &&
        ((local_2752 = true, main::x[0xc] == 'd' && (local_2752 = true, main::x[0xd] == 'c'))))))))
     && (local_2752 = true, main::x[0xe] == 'b')) {
    local_2752 = main::x[0xf] != 'a';
  }
  _PrintTest(0x287,"nifti_swap_16bytes",(uint)local_2752,NIFTITEST_FALSE,(int *)&local_11c);
  nifti_swap_Nbytes(1,8,main::x_1);
  local_2753 = true;
  if (((main::x_1[0] == 'A') && (local_2753 = true, main::x_1[1] == 'B')) &&
     (((local_2753 = true, main::x_1[2] == 'C' &&
       (((local_2753 = true, main::x_1[3] == 'D' && (local_2753 = true, main::x_1[4] == 'd')) &&
        (local_2753 = true, main::x_1[5] == 'c')))) && (local_2753 = true, main::x_1[6] == 'b')))) {
    local_2753 = main::x_1[7] != 'a';
  }
  _PrintTest(0x290,"nifti_swap_8bytes",(uint)local_2753,NIFTITEST_FALSE,(int *)&local_11c);
  f = (znzFile)nifti_simple_init_nim();
  _PrintTest(0x299,"nifti_simple_init_nim",(uint)((nifti_image *)f == (nifti_image *)0x0),
             NIFTITEST_FALSE,(int *)&local_11c);
  nifti_image_free((nifti_image *)f);
  f = (znzFile)0x0;
  local_23a8 = nifti_image_open("ATestReferenceImageForReadingAndWriting.hdr","r",(nifti_image **)&f
                               );
  local_2754 = f == (znzFile)0x0 || local_23a8 == (znzFile)0x0;
  _PrintTest(0x2a1,"nifti_image_open",(uint)local_2754,NIFTITEST_FALSE,(int *)&local_11c);
  iVar1 = nifti_image_load((nifti_image *)f);
  _PrintTest(0x2a4,"nifti_image_load",(uint)(iVar1 == -1),NIFTITEST_FALSE,(int *)&local_11c);
  nifti_image_unload((nifti_image *)f);
  _PrintTest(0x2a8,"nifti_image_unload",(uint)(f[0x1b].zfptr != (gzFile)0x0),NIFTITEST_FALSE,
             (int *)&local_11c);
  Xznzclose(&local_23a8);
  nifti_image_free((nifti_image *)f);
  printf("\n\nTOTAL ERRORS=%d\n",(ulong)local_11c);
  return local_11c;
}

Assistant:

int main (int argc, char *argv[])
{
  char TEMP_STR[256];
  nifti_set_debug_level(3);
  int Errors=0;
  {
  PrintTest("NOT REALLY AN ERROR, JUST TESTING THE ERROR TEST REPORTING MECHANISM",1,NIFTITEST_FALSE,&Errors);
  PrintTest("NOT REALLY AN ERROR, JUST TESTING THE ERROR COUNTING MECHANISM",Errors==1,NIFTITEST_FALSE,&Errors);
  Errors=0;
  }
  {
  const char write_image_filename[6][64]={
    "ATestReferenceImageForReadingAndWriting.nii",
    "ATestReferenceImageForReadingAndWriting.hdr",
    "ATestReferenceImageForReadingAndWriting.img",
    "ATestReferenceImageForReadingAndWriting.nii.gz",
    "ATestReferenceImageForReadingAndWriting.hdr.gz",
    "ATestReferenceImageForReadingAndWriting.img.gz"
  };
  printf("======= Testing All Nifti Valid Names ======\n");
  fflush(stdout);
  unsigned int filenameindex;
  for(filenameindex=0;filenameindex<6; filenameindex++)
    {
    char buf[512];
    int CompressedTwoFile = strstr(write_image_filename[filenameindex],".img.gz") != 0 ||
      strstr(write_image_filename[filenameindex],".hdr.gz") != 0;

    printf("======= Testing with filename: %s ======\n",write_image_filename[filenameindex]);
    fflush(stdout);
    nifti_image * reference_image = generate_reference_image(write_image_filename[filenameindex],&Errors);
    /*
     * Add an extension to test extension reading
     */
    {
    static char ext[] = "THIS IS A TEST";
    sprintf(buf,"nifti_add_extension %s",write_image_filename[filenameindex]);
    PrintTest(buf,
              nifti_add_extension(reference_image,
                                  ext,sizeof(ext),
                                  NIFTI_ECODE_COMMENT) == -1,
              NIFTITEST_FALSE,&Errors);
    sprintf(buf,"valid_nifti_extension %s",write_image_filename[filenameindex]);
    PrintTest("valid_nifti_extensions",
              valid_nifti_extensions(reference_image) == 0,
              NIFTITEST_FALSE,&Errors);
    }
    PrintTest("Create reference image",reference_image==0,NIFTITEST_TRUE,&Errors);
    nifti_image_write   ( reference_image ) ;
    /*
     * test nifti_copy_extension
     */
    {
      nifti_image *nim = nifti_simple_init_nim();
      PrintTest("nifti_copy_extension",
                nifti_copy_extensions(nim,reference_image),
                NIFTITEST_FALSE,&Errors);

      nifti_image_free(nim);
      nim = nifti_copy_nim_info(reference_image);
      PrintTest("nifti_copy_nim_info",
                nim == 0,
                NIFTITEST_FALSE,&Errors);
      PrintTest("nifti_nim_is_valid",
                nifti_nim_is_valid(nim,0) == 0,
                NIFTITEST_FALSE,&Errors);


      nifti_image_free(nim);

    }
    {
    nifti_image * reloaded_image = nifti_image_read(reference_image->fname,1);
    PrintTest("Reload of image ",reloaded_image==0,NIFTITEST_TRUE,&Errors);

    {
    /*
     * if the file is named '.img', '.hdr', '.img.gz', or '.hdr.gz', then
     * the header extensions won't be saved with the file.
     * The test will fail if it finds an extension in a 2-file NIfTI, or
     * fails to find one in a '.nii' or '.nii.gz' file.
     */
    int result = valid_nifti_extensions(reloaded_image);
    sprintf(buf,"reload valid_nifti_extensions %s",write_image_filename[filenameindex]);
      PrintTest(buf,
                CompressedTwoFile ? result != 0 : result == 0,
                NIFTITEST_FALSE,&Errors);
    }
    nifti_image_infodump(reloaded_image);
    compare_reference_image_values(reference_image,reloaded_image,&Errors);
    nifti_image_free(reloaded_image);
    }

    {
    nifti_brick_list   NB_orig, NB_select;

    nifti_image      * nim_orig, * nim_select;

    int                blist[5] = { 7, 0, 5, 5, 9 };

    /*
     * test some error paths in the nifti_image_read_bricks
     */
    nim_orig = nifti_image_read_bricks(reference_image->fname,0,blist, &NB_orig);
    PrintTest("invalid arg bricked image read 1",nim_orig != 0,NIFTITEST_FALSE,&Errors);

    nim_orig   = nifti_image_read_bricks(reference_image->fname, 0, NULL,  &NB_orig);
    PrintTest("Reload of bricked image",nim_orig == 0,NIFTITEST_FALSE,&Errors);
    nifti_free_NBL(&NB_orig);
    nifti_image_free(nim_orig);

    nim_select = nifti_image_read_bricks(reference_image->fname, 5, blist, &NB_select);
    PrintTest("Reload of bricked image with blist",nim_orig == 0,NIFTITEST_FALSE,&Errors);
    nifti_free_NBL(&NB_select);
    nifti_image_free(nim_select);

    }
    /*
     * test nifti_update_dims_from_array
     */
    PrintTest("nifti_update_dims_from_array -- valid dims",
              nifti_update_dims_from_array(reference_image) != 0,
              NIFTITEST_FALSE,&Errors);
    reference_image->dim[0] = 8;
    PrintTest("nifti_update_dims_from_array -- invalid dims",
              nifti_update_dims_from_array(reference_image) == 0,
              NIFTITEST_FALSE,&Errors);
    {
    nifti_1_header x = nifti_convert_nim2nhdr(reference_image);
    char buf[512];
    sprintf(buf,"nifti_hdr_looks_good %s",reference_image->fname);
    PrintTest(buf,
              !nifti_hdr_looks_good(&x),
              NIFTITEST_FALSE,&Errors);
    }

    nifti_image_free(reference_image);
    }
  /*
   * check nifti_findimgname
   */
  {
  char *imgname = nifti_findimgname("ATestReferenceImageForReadingAndWriting.hdr",2);
  PrintTest("nifti_findimgname",
            imgname == 0 ||
            strcmp(imgname,"ATestReferenceImageForReadingAndWriting.img") != 0,
            NIFTITEST_FALSE,&Errors);
  free(imgname);
  }
  {
  int IsNiftiFile;
  IsNiftiFile = is_nifti_file(write_image_filename[0]);
  PrintTest("is_nifti_file0",
            IsNiftiFile != 1,NIFTITEST_FALSE,&Errors);
  IsNiftiFile = is_nifti_file(write_image_filename[1]);
  PrintTest("is_nifti_file1",
            IsNiftiFile != 2,NIFTITEST_FALSE,&Errors);
  IsNiftiFile = is_nifti_file(write_image_filename[3]);
  PrintTest("is_nifti_file2",
            IsNiftiFile != 1,NIFTITEST_FALSE,&Errors);
  IsNiftiFile = is_nifti_file(write_image_filename[4]);
  PrintTest("is_nifti_file2",
            IsNiftiFile != 2,NIFTITEST_FALSE,&Errors);
  }

  }
  {
  /*
   * test writing and reading an ascii file
   */
  nifti_image * reference_image =
    generate_reference_image("TestAsciiImage.nia",&Errors);
  reference_image->nifti_type = 3;
  nifti_image_write(reference_image);
  nifti_image * reloaded_image = nifti_image_read("TestAsciiImage.nia",1);
  PrintTest("Read/Write Ascii image",
            reloaded_image == 0,NIFTITEST_FALSE,&Errors);
  nifti_image_free(reference_image);
  nifti_image_free(reloaded_image);
  }

  {
  enum { NUM_FILE_NAMES=8 };
  const char * FILE_NAMES[NUM_FILE_NAMES]={
    "myimage",
    "myimage.tif",
    "myimage.tif.gz",
    "myimage.nii",
    "myimage.img.gz",
    ".nii",
    ".myhiddenimage",
    ".myhiddenimage.nii"
  };
  const char * KNOWN_FILE_BASENAMES[NUM_FILE_NAMES]={
    "myimage",
    "myimage.tif",
    "myimage.tif.gz",
    "myimage",
    "myimage",
    "",
    ".myhiddenimage",
    ".myhiddenimage"
  };
  const int KNOWN_nifti_validfilename[NUM_FILE_NAMES]={
    1,
    1,
    1,
    1,
    1,
    0,
    1,
    1
  };
  const int KNOWN_nifti_is_complete_filename[NUM_FILE_NAMES]={
    0,
    0,
    0,
    1,
    1,
    0,
    0,
    1
  };
  unsigned int fni;
  for(fni=0;fni<NUM_FILE_NAMES;fni++)
    {
    printf("\nTesting \"%s\" filename\n",FILE_NAMES[fni]);
    {
    int KnownValid=nifti_validfilename(FILE_NAMES[fni]);
    snprintf(TEMP_STR,256,"nifti_validfilename(\"%s\")=%d",FILE_NAMES[fni],KnownValid);
    PrintTest(TEMP_STR,KnownValid != KNOWN_nifti_validfilename[fni],NIFTITEST_FALSE,&Errors);
    }
    {
    int KnownValid=nifti_is_complete_filename(FILE_NAMES[fni]);
    snprintf(TEMP_STR,256,"nifti_is_complete_filename(\"%s\")=%d",FILE_NAMES[fni],KnownValid);
    PrintTest(TEMP_STR,KnownValid != KNOWN_nifti_is_complete_filename[fni],NIFTITEST_FALSE,&Errors);
    }

    {
    char * basename=nifti_makebasename(FILE_NAMES[fni]);
    snprintf(TEMP_STR,256,"nifti_makebasename(\"%s\")=\"%s\"",FILE_NAMES[fni],basename);
    PrintTest(TEMP_STR,strcmp(basename,KNOWN_FILE_BASENAMES[fni]) != 0,NIFTITEST_FALSE,&Errors);
    free(basename);

    }
    }
  /*
   * the following 2 calls aren't tested, because all they do is display
   * compile-time information -- no way to fail unless writing to stdout fails.
   */
  nifti_disp_lib_hist();
  nifti_disp_lib_version();
  /*
   * the following exercises error path code in nifti_image_read_bricks
   */
  PrintTest(
            "nifti_image_read_bricks 1",
            nifti_image_read_bricks((char *)0,-1,(const int *)0,(nifti_brick_list *)0) != 0,
            NIFTITEST_FALSE,
            &Errors);
  PrintTest(
            "nifti_image_read_bricks 1",
            nifti_image_read_bricks("NOFILE.NOFILE",-1,(const int *)0,(nifti_brick_list *)0) != 0,
            NIFTITEST_FALSE,
            &Errors);
  }
  /*
   * call nifti_datatype_string with all possible values
   */
#define nifti_datatype_test(constant,string)                            \
  {                                                                     \
  char buf[64];                                                         \
  sprintf(buf,"nifti_datatype_string %s",string);                       \
  PrintTest(                                                   \
            buf,                                                        \
            strcmp(nifti_datatype_string(constant),string) != 0,        \
            NIFTITEST_FALSE,                                            \
            &Errors);                                                   \
  }
  nifti_datatype_test(DT_UNKNOWN,"UNKNOWN");
  nifti_datatype_test(DT_BINARY, "BINARY");
  nifti_datatype_test(DT_INT8, "INT8");
  nifti_datatype_test(DT_UINT8, "UINT8");
  nifti_datatype_test(DT_INT16, "INT16");
  nifti_datatype_test(DT_UINT16, "UINT16");
  nifti_datatype_test(DT_INT32, "INT32");
  nifti_datatype_test(DT_UINT32, "UINT32");
  nifti_datatype_test(DT_INT64, "INT64");
  nifti_datatype_test(DT_UINT64, "UINT64");
  nifti_datatype_test(DT_FLOAT32, "FLOAT32");
  nifti_datatype_test(DT_FLOAT64, "FLOAT64");
  nifti_datatype_test(DT_FLOAT128, "FLOAT128");
  nifti_datatype_test(DT_COMPLEX64, "COMPLEX64");
  nifti_datatype_test(DT_COMPLEX128, "COMPLEX128");
  nifti_datatype_test(DT_COMPLEX256, "COMPLEX256");
  nifti_datatype_test(DT_RGB24, "RGB24");
#define nifti_is_inttype_test(constant,rval)            \
  {                                                     \
  char buf[64];                                         \
  sprintf(buf,"nifti_datatype_string %d",constant);     \
  PrintTest(                                   \
            buf,                                        \
            nifti_is_inttype(constant) != rval,         \
            NIFTITEST_FALSE,                            \
            &Errors);                                   \
  }
  nifti_is_inttype_test(DT_UNKNOWN,0);
  nifti_is_inttype_test(DT_BINARY,0);
  nifti_is_inttype_test(DT_INT8,1);
  nifti_is_inttype_test(DT_UINT8,1);
  nifti_is_inttype_test(DT_INT16,1);
  nifti_is_inttype_test(DT_UINT16,1);
  nifti_is_inttype_test(DT_INT32,1);
  nifti_is_inttype_test(DT_UINT32,1);
  nifti_is_inttype_test(DT_INT64,1);
  nifti_is_inttype_test(DT_UINT64,1);
  nifti_is_inttype_test(DT_FLOAT32,0);
  nifti_is_inttype_test(DT_FLOAT64,0);
  nifti_is_inttype_test(DT_FLOAT128,0);
  nifti_is_inttype_test(DT_COMPLEX64,0);
  nifti_is_inttype_test(DT_COMPLEX128,0);
  nifti_is_inttype_test(DT_COMPLEX256,0);
  nifti_is_inttype_test(DT_RGB24,1);
#define nifti_units_string_test(constant,string)                \
  {                                                             \
  char buf[64];                                                 \
  sprintf(buf,"nifti_units_string_test %s",string);             \
  PrintTest(                                           \
            buf,                                                \
            strcmp(nifti_units_string(constant),string) != 0,   \
            NIFTITEST_FALSE,                                    \
            &Errors);                                           \
  }
  nifti_units_string_test(NIFTI_UNITS_METER,"m");
  nifti_units_string_test(NIFTI_UNITS_MM,"mm");
  nifti_units_string_test(NIFTI_UNITS_MICRON,"um");
  nifti_units_string_test(NIFTI_UNITS_SEC,"s");
  nifti_units_string_test(NIFTI_UNITS_MSEC,"ms");
  nifti_units_string_test(NIFTI_UNITS_USEC,"us");
  nifti_units_string_test(NIFTI_UNITS_HZ,"Hz");
  nifti_units_string_test(NIFTI_UNITS_PPM,"ppm");
  nifti_units_string_test(NIFTI_UNITS_RADS,"rad/s");
#define nifti_intent_string_test(constant,string)               \
  {                                                             \
  char buf[64];                                                 \
  sprintf(buf,"nifti_intent_string %s",string);                 \
  PrintTest(                                           \
            buf,                                                \
            strcmp(nifti_intent_string(constant),string) != 0,  \
            NIFTITEST_FALSE,                                    \
            &Errors);                                           \
  }
  nifti_intent_string_test(NIFTI_INTENT_CORREL,"Correlation statistic");
  nifti_intent_string_test(NIFTI_INTENT_TTEST,"T-statistic");
  nifti_intent_string_test(NIFTI_INTENT_FTEST,"F-statistic");
  nifti_intent_string_test(NIFTI_INTENT_ZSCORE,"Z-score");
  nifti_intent_string_test(NIFTI_INTENT_CHISQ,"Chi-squared distribution");
  nifti_intent_string_test(NIFTI_INTENT_BETA,"Beta distribution");
  nifti_intent_string_test(NIFTI_INTENT_BINOM,"Binomial distribution");
  nifti_intent_string_test(NIFTI_INTENT_GAMMA,"Gamma distribution");
  nifti_intent_string_test(NIFTI_INTENT_POISSON,"Poisson distribution");
  nifti_intent_string_test(NIFTI_INTENT_NORMAL,"Normal distribution");
  nifti_intent_string_test(NIFTI_INTENT_FTEST_NONC,"F-statistic noncentral");
  nifti_intent_string_test(NIFTI_INTENT_CHISQ_NONC,"Chi-squared noncentral");
  nifti_intent_string_test(NIFTI_INTENT_LOGISTIC,"Logistic distribution");
  nifti_intent_string_test(NIFTI_INTENT_LAPLACE,"Laplace distribution");
  nifti_intent_string_test(NIFTI_INTENT_UNIFORM,"Uniform distribition");
  nifti_intent_string_test(NIFTI_INTENT_TTEST_NONC,"T-statistic noncentral");
  nifti_intent_string_test(NIFTI_INTENT_WEIBULL,"Weibull distribution");
  nifti_intent_string_test(NIFTI_INTENT_CHI,"Chi distribution");
  nifti_intent_string_test(NIFTI_INTENT_INVGAUSS,"Inverse Gaussian distribution");
  nifti_intent_string_test(NIFTI_INTENT_EXTVAL,"Extreme Value distribution");
  nifti_intent_string_test(NIFTI_INTENT_PVAL,"P-value");
  nifti_intent_string_test(NIFTI_INTENT_LOGPVAL,"Log P-value");
  nifti_intent_string_test(NIFTI_INTENT_LOG10PVAL,"Log10 P-value");
  nifti_intent_string_test(NIFTI_INTENT_ESTIMATE,"Estimate");
  nifti_intent_string_test(NIFTI_INTENT_LABEL,"Label index");
  nifti_intent_string_test(NIFTI_INTENT_NEURONAME,"NeuroNames index");
  nifti_intent_string_test(NIFTI_INTENT_GENMATRIX,"General matrix");
  nifti_intent_string_test(NIFTI_INTENT_SYMMATRIX,"Symmetric matrix");
  nifti_intent_string_test(NIFTI_INTENT_DISPVECT,"Displacement vector");
  nifti_intent_string_test(NIFTI_INTENT_VECTOR,"Vector");
  nifti_intent_string_test(NIFTI_INTENT_POINTSET,"Pointset");
  nifti_intent_string_test(NIFTI_INTENT_TRIANGLE,"Triangle");
  nifti_intent_string_test(NIFTI_INTENT_QUATERNION,"Quaternion");
  nifti_intent_string_test(NIFTI_INTENT_DIMLESS,"Dimensionless number");
  nifti_intent_string_test(-200,"Unknown");

#define nifti_slice_string_test(constant,string)                \
  {                                                             \
  char buf[64];                                                 \
  sprintf(buf,"nifti_slice_string_test %s",string);             \
  PrintTest(                                           \
            buf,                                                \
            strcmp(nifti_slice_string(constant),string) != 0,   \
            NIFTITEST_FALSE,                                    \
            &Errors);                                           \
  }
  nifti_slice_string_test(NIFTI_SLICE_SEQ_INC,"sequential_increasing");
  nifti_slice_string_test(NIFTI_SLICE_SEQ_DEC,"sequential_decreasing");
  nifti_slice_string_test(NIFTI_SLICE_ALT_INC,"alternating_increasing");
  nifti_slice_string_test(NIFTI_SLICE_ALT_DEC,"alternating_decreasing");
  nifti_slice_string_test(NIFTI_SLICE_ALT_INC2,"alternating_increasing_2");
  nifti_slice_string_test(NIFTI_SLICE_ALT_DEC2,"alternating_decreasing_2");
#define nifti_orientation_string_test(constant,string)                  \
  {                                                                     \
  char buf[64];                                                         \
  sprintf(buf,"nifti_orientation_string_test %s",string);               \
  PrintTest(                                                   \
            buf,                                                        \
            strcmp(nifti_orientation_string(constant),string) != 0,     \
            NIFTITEST_FALSE,                                            \
            &Errors);                                                   \
  }
  nifti_orientation_string_test(NIFTI_L2R,"Left-to-Right");
  nifti_orientation_string_test(NIFTI_R2L,"Right-to-Left");
  nifti_orientation_string_test(NIFTI_P2A,"Posterior-to-Anterior");
  nifti_orientation_string_test(NIFTI_A2P,"Anterior-to-Posterior");
  nifti_orientation_string_test(NIFTI_I2S,"Inferior-to-Superior");
  nifti_orientation_string_test(NIFTI_S2I,"Superior-to-Inferior");

#define nifti_datatype_sizes_test(constant,Nbyper,Swapsize)     \
  {                                                             \
  int nbyper;                                                   \
  int swapsize;                                                 \
  char buf[64];                                                 \
  sprintf(buf,"nifti_datatype_sizes_test %d",constant);         \
  nifti_datatype_sizes(constant,&nbyper,&swapsize);             \
  PrintTest(                                           \
            buf,                                                \
            nbyper != Nbyper || swapsize != Swapsize,           \
            NIFTITEST_FALSE,                                    \
            &Errors);                                           \
  }

  nifti_datatype_sizes_test(DT_UINT8,1,0);
  nifti_datatype_sizes_test(DT_UINT16,2,2);
  nifti_datatype_sizes_test(DT_RGB24,3,0);
  nifti_datatype_sizes_test(DT_FLOAT32,4,4);
  nifti_datatype_sizes_test(DT_COMPLEX64,8,4);
  nifti_datatype_sizes_test(DT_UINT64,8,8);
  nifti_datatype_sizes_test(DT_FLOAT128,16,16);
  nifti_datatype_sizes_test(DT_COMPLEX128,16,8);
  nifti_datatype_sizes_test(DT_COMPLEX256,32,16);

  {
  mat44 R;
  unsigned i,j;
  for(i = 0; i < 4; i++)
    for(j = 0; j < 4; j++)
      R.m[i][j] = (i == j ? 1 : 0);
  float qb;
  float qc;
  float qd;
  float qx;
  float qy;
  float qz;
  float dx;
  float dy;
  float dz;
  float qfac;
  nifti_mat44_to_quatern(R,&qb,&qc,&qd,&qx,&qy,&qz,&dx,&dy,&dz,&qfac);
  PrintTest("nifti_mat44_to_quatern",
            qb != 0.000000 || qc != 0.000000 || qd != 0.000000 ||
            qx != 0.000000 || qy != 0.000000 || qd != 0.000000 ||
            dx != 1.000000 || dy != 1.000000 || dz != 1.000000 ||
            qfac != 1.000000,
            NIFTITEST_FALSE,&Errors);
  }
  {
  mat44 x = nifti_make_orthog_mat44(0.14,0.0,0.0,
                                    0.0,0.9,0.0,
                                    0.0,0.0,1.1);

  PrintTest("nifti_make_orthog_mat44",
            x.m[0][0] != 1.0 || x.m[1][1] != 1.0 ||
            x.m[2][2] != 1.0 || x.m[3][3] != 1.0,
            NIFTITEST_FALSE,&Errors);
  }
  {
  static char x[16] = { 'a','b','c','d','e','f','g','h',
                        'H','G','F','E','D','C','B','A' };
  nifti_swap_Nbytes(1,16,(void *)x);
  PrintTest("nifti_swap_16bytes",
            x[0] != 'A' || x[1] != 'B' || x[2] != 'C' || x[3] != 'D' ||
            x[4] != 'E' || x[5] != 'F' || x[6] != 'G' || x[7] != 'H' ||
            x[8] != 'h' || x[9] != 'g' || x[10] != 'f' || x[11] != 'e' ||
            x[12] != 'd' || x[13] != 'c' || x[14] != 'b' || x[15] != 'a',
            NIFTITEST_FALSE,&Errors);

  }
  {
  static char x[8] = { 'a','b','c','d','D','C','B','A' };
  nifti_swap_Nbytes(1,8,(void *)x);
  PrintTest("nifti_swap_8bytes",
            x[0] != 'A' || x[1] != 'B' || x[2] != 'C' || x[3] != 'D' ||
            x[4] != 'd' || x[5] != 'c' || x[6] != 'b' || x[7] != 'a',
            NIFTITEST_FALSE,&Errors);

  }
  {
  /*
   * test nifti_simple_init_nim
   */
  nifti_image *nim = nifti_simple_init_nim();
  PrintTest("nifti_simple_init_nim",
            nim == 0,NIFTITEST_FALSE,&Errors);
  nifti_image_free(nim); nim = 0;
  /*
   * test nifti_image_open
   */
  znzFile f = nifti_image_open("ATestReferenceImageForReadingAndWriting.hdr","r",&nim);
  PrintTest("nifti_image_open",
            nim == 0 || f == 0,
            NIFTITEST_FALSE,&Errors);
  PrintTest("nifti_image_load",
            nifti_image_load(nim) == -1,
            NIFTITEST_FALSE,&Errors);
  nifti_image_unload(nim);
  PrintTest("nifti_image_unload",
            nim->data != 0,
            NIFTITEST_FALSE,&Errors);

  znzclose(f);
  nifti_image_free(nim);
  }
  /*
   * call various functions from nifti_stats
   */
  printf("\n\nTOTAL ERRORS=%d\n",Errors);
  return Errors;
}